

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_transfer(CHAR_DATA *ch,char *argument)

{
  __type_conflict2 _Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *pCVar5;
  DESCRIPTOR_DATA *pDVar6;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA *in_RDI;
  string buffer;
  CHAR_DATA *victim;
  DESCRIPTOR_DATA *d;
  ROOM_INDEX_DATA *location;
  char arg2 [4608];
  char arg1 [4608];
  char *in_stack_000036e0;
  CHAR_DATA *in_stack_000036e8;
  undefined7 in_stack_ffffffffffffda88;
  undefined1 in_stack_ffffffffffffda8f;
  undefined4 in_stack_ffffffffffffda90;
  undefined4 in_stack_ffffffffffffda94;
  CHAR_DATA *in_stack_ffffffffffffda98;
  DESCRIPTOR_DATA *in_stack_ffffffffffffdaa0;
  GEN_DATA *in_stack_ffffffffffffdaa8;
  ROOM_INDEX_DATA *in_stack_ffffffffffffdab8;
  CHAR_DATA *in_stack_ffffffffffffdac0;
  undefined1 local_2530 [16];
  CHAR_DATA *in_stack_ffffffffffffdae0;
  DESCRIPTOR_DATA *local_24f8;
  char local_24e8 [472];
  format_args in_stack_ffffffffffffdcf0;
  string_view in_stack_ffffffffffffdd00;
  char local_12e8 [4472];
  char *in_stack_fffffffffffffe90;
  CHAR_DATA *in_stack_fffffffffffffe98;
  char *in_stack_ffffffffffffff10;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  char **local_98;
  char **local_90;
  undefined1 local_88 [32];
  DESCRIPTOR_DATA *local_68;
  MOB_INDEX_DATA *local_60;
  DESCRIPTOR_DATA *local_58;
  AFFECT_DATA *local_50;
  CHAR_DATA *local_48;
  GEN_DATA *local_38;
  PC_DATA *local_30;
  GEN_DATA *local_28;
  AREA_DATA_conflict *local_20;
  PC_DATA *local_18;
  GEN_DATA *local_10;
  PATHFIND_DATA *local_8;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffda94,in_stack_ffffffffffffda90),
               (char *)CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88));
  pCVar5 = (CHAR_DATA *)
           one_argument((char *)CONCAT44(in_stack_ffffffffffffda94,in_stack_ffffffffffffda90),
                        (char *)CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88));
  if (local_12e8[0] == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
  }
  else {
    bVar2 = str_cmp(local_12e8,"all");
    if (bVar2) {
      if (local_24e8[0] != '\0') {
        pRoomIndex = find_location(in_stack_ffffffffffffda98,
                                   (char *)CONCAT44(in_stack_ffffffffffffda94,
                                                    in_stack_ffffffffffffda90));
        if (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
          send_to_char((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
          return;
        }
        in_stack_ffffffffffffda98 = (CHAR_DATA *)pRoomIndex->room_flags[0];
        _Var1 = std::pow<int,int>(0,0x588b14);
        if ((((ulong)in_stack_ffffffffffffda98 & (long)_Var1) != 0) && (in_RDI->level < 0x3c)) {
          send_to_char((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
          return;
        }
        bVar2 = is_room_owner((CHAR_DATA *)
                              CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88),
                              (ROOM_INDEX_DATA *)0x588b69);
        if (((!bVar2) && (bVar2 = room_is_private(pRoomIndex), bVar2)) && (in_RDI->level < 0x3c)) {
          send_to_char((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
          return;
        }
      }
      pCVar5 = get_char_world(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      if (pCVar5 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
      }
      else if (pCVar5->in_room == (ROOM_INDEX_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
      }
      else {
        iVar3 = get_trust((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88)
                         );
        iVar4 = get_trust((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88)
                         );
        if (((iVar3 < iVar4) ||
            (bVar2 = is_npc((CHAR_DATA *)
                            CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88)), bVar2))
           || (in_RDI->level == 0x3c)) {
          if (pCVar5->fighting != (CHAR_DATA *)0x0) {
            stop_fighting((CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffda90),
                          (bool)in_stack_ffffffffffffda8f);
          }
          act((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98,
              (void *)CONCAT44(iVar3,in_stack_ffffffffffffda90),
              (void *)CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88),0);
          char_from_room(in_stack_ffffffffffffdae0);
          char_to_room(in_stack_ffffffffffffdac0,in_stack_ffffffffffffdab8);
          act((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98,
              (void *)CONCAT44(iVar3,in_stack_ffffffffffffda90),
              (void *)CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88),0);
          if (in_RDI != pCVar5) {
            act((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98,
                (void *)CONCAT44(iVar3,in_stack_ffffffffffffda90),
                (void *)CONCAT17(in_stack_ffffffffffffda8f,in_stack_ffffffffffffda88),0);
          }
          do_look(in_stack_000036e8,in_stack_000036e0);
          send_to_char((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
        }
        else {
          send_to_char((char *)in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
        }
      }
    }
    else {
      for (local_24f8 = descriptor_list; local_24f8 != (DESCRIPTOR_DATA *)0x0;
          local_24f8 = local_24f8->next) {
        if (((local_24f8->connected == 0) && (local_24f8->character != in_RDI)) &&
           ((local_24f8->character->in_room != (ROOM_INDEX_DATA *)0x0 &&
            (bVar2 = can_see((CHAR_DATA *)in_stack_ffffffffffffdaa8,
                             (CHAR_DATA *)in_stack_ffffffffffffdaa0), bVar2)))) {
          in_stack_ffffffffffffdaa0 = (DESCRIPTOR_DATA *)local_2530;
          local_88._24_8_ = "{} {}";
          local_60 = (MOB_INDEX_DATA *)0x7eb971;
          local_2530._0_8_ = "{} {}";
          local_68 = in_stack_ffffffffffffdaa0;
          local_58 = in_stack_ffffffffffffdaa0;
          pDVar6 = (DESCRIPTOR_DATA *)std::char_traits<char>::length((char_type *)0x5888a0);
          in_stack_ffffffffffffdaa0->snoop_by = pDVar6;
          local_8 = (PATHFIND_DATA *)local_88._24_8_;
          local_90 = &local_24f8->character->name;
          local_88._16_8_ = &stack0xffffffffffffdae0;
          local_88._0_8_ = local_2530._0_8_;
          local_88._8_8_ = local_2530._8_8_;
          local_98 = (char **)local_24e8;
          local_50 = (AFFECT_DATA *)local_88;
          local_b8._16_8_ = local_2530._0_8_;
          in_stack_ffffffffffffdaa8 = (GEN_DATA *)local_d8;
          local_48 = (CHAR_DATA *)local_b8._16_8_;
          fmt::v9::
          make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char(&)[4608]>
                    ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
                      *)in_stack_ffffffffffffdaa8,(v9 *)local_90,local_98,
                     (char (*) [4608])local_2530._0_8_);
          local_30 = (PC_DATA *)local_b8;
          local_20 = (AREA_DATA_conflict *)0xcc;
          local_b8._0_8_ = (PC_DATA *)0xcc;
          local_38 = in_stack_ffffffffffffdaa8;
          local_28 = in_stack_ffffffffffffdaa8;
          local_18 = local_30;
          local_10 = in_stack_ffffffffffffdaa8;
          local_b8._8_8_ = in_stack_ffffffffffffdaa8;
          fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf0);
          std::__cxx11::string::data();
          do_transfer(pCVar5,in_stack_ffffffffffffff10);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffdae0);
        }
      }
    }
  }
  return;
}

Assistant:

void do_transfer(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	ROOM_INDEX_DATA *location;
	DESCRIPTOR_DATA *d;
	CHAR_DATA *victim;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Transfer whom (and where)?\n\r", ch);
		return;
	}

	if (!str_cmp(arg1, "all"))
	{
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->connected == CON_PLAYING
				&& d->character != ch
				&& d->character->in_room != nullptr
				&& can_see(ch, d->character))
			{
				auto buffer = fmt::format("{} {}", d->character->name, arg2);
				do_transfer(ch, buffer.data());
			}
		}

		return;
	}

	/*
	 * Thanks to Grodyn for the optional location parameter.
	 */
	if (arg2[0] == '\0')
	{
		location = ch->in_room;
	}
	else
	{
		location = find_location(ch, arg2);

		if (location == nullptr)
		{
			send_to_char("No such location.\n\r", ch);
			return;
		}

		if (IS_SET(location->room_flags, ROOM_IMP_ONLY) && ch->level < 60)
		{
			send_to_char("Access denied.\n\r", ch);
			return;
		}

		if (!is_room_owner(ch, location) && room_is_private(location) && ch->level < MAX_LEVEL)
		{
			send_to_char("Access denied.\n\r", ch);
			return;
		}
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim->in_room == nullptr)
	{
		send_to_char("They are in limbo.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch) && !is_npc(victim) && ch->level != 60)
	{
		send_to_char("They are too high for you to mess with.\n\r", ch);
		return;
	}

	if (victim->fighting != nullptr)
		stop_fighting(victim, true);

	act("$n disappears in a mushroom cloud.", victim, nullptr, nullptr, TO_ROOM);

	char_from_room(victim);
	char_to_room(victim, location);

	act("$n arrives from a puff of smoke.", victim, nullptr, nullptr, TO_ROOM);

	if (ch != victim)
		act("$n has transferred you.", ch, nullptr, victim, TO_VICT);

	do_look(victim, "auto");

	send_to_char("Ok.\n\r", ch);
}